

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

void deqp::gls::ub::anon_unknown_12::generateFragmentShader
               (ostringstream *src,GLSLVersion glslVersion,ShaderInterface *interface,
               UniformLayout *layout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *blockPointers)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  char *pcVar4;
  ostream *poVar5;
  reference ppSVar6;
  UniformBlock *this;
  UniformBlock *block;
  int blockNdx;
  __normal_iterator<const_deqp::gls::ub::StructType_**,_std::vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>_>
  local_70;
  __normal_iterator<const_deqp::gls::ub::StructType_**,_std::vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>_>
  local_68;
  __normal_iterator<const_deqp::gls::ub::StructType_*const_*,_std::vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>_>
  local_60;
  const_iterator structIter;
  undefined1 local_48 [8];
  vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
  namedStructs;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
  *blockPointers_local;
  UniformLayout *layout_local;
  ShaderInterface *interface_local;
  GLSLVersion glslVersion_local;
  ostringstream *src_local;
  
  namedStructs.
  super__Vector_base<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)blockPointers;
  pcVar4 = glu::getGLSLVersionDeclaration(glslVersion);
  poVar5 = std::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,pcVar4);
  std::operator<<(poVar5,"\n");
  std::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,
                  "in mediump float v_vtxResult;\n");
  std::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,
                  "layout(location = 0) out mediump vec4 dEQP_FragColor;\n");
  std::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
  ::vector((vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
            *)local_48);
  ShaderInterface::getNamedStructs
            (interface,
             (vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
              *)local_48);
  local_68._M_current =
       (StructType **)
       std::
       vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
       ::begin((vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
                *)local_48);
  __gnu_cxx::
  __normal_iterator<deqp::gls::ub::StructType_const*const*,std::vector<deqp::gls::ub::StructType_const*,std::allocator<deqp::gls::ub::StructType_const*>>>
  ::__normal_iterator<deqp::gls::ub::StructType_const**>
            ((__normal_iterator<deqp::gls::ub::StructType_const*const*,std::vector<deqp::gls::ub::StructType_const*,std::allocator<deqp::gls::ub::StructType_const*>>>
              *)&local_60,&local_68);
  while( true ) {
    local_70._M_current =
         (StructType **)
         std::
         vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
         ::end((vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
                *)local_48);
    bVar1 = __gnu_cxx::operator!=(&local_60,&local_70);
    if (!bVar1) break;
    ppSVar6 = __gnu_cxx::
              __normal_iterator<const_deqp::gls::ub::StructType_*const_*,_std::vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>_>
              ::operator*(&local_60);
    generateDeclaration(src,*ppSVar6,0);
    __gnu_cxx::
    __normal_iterator<const_deqp::gls::ub::StructType_*const_*,_std::vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>_>
    ::operator++(&local_60,0);
  }
  block._4_4_ = 0;
  while( true ) {
    iVar2 = ShaderInterface::getNumUniformBlocks(interface);
    if (iVar2 <= block._4_4_) break;
    this = ShaderInterface::getUniformBlock(interface,block._4_4_);
    dVar3 = UniformBlock::getFlags(this);
    if ((dVar3 & 0x200) != 0) {
      generateDeclaration(src,this);
    }
    block._4_4_ = block._4_4_ + 1;
  }
  std::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  generateCompareFuncs(&src->super_basic_ostream<char,_std::char_traits<char>_>,interface);
  std::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,
                  "\nvoid main (void)\n{\n\tmediump float result = 1.0;\n");
  generateCompareSrc(src,"result",interface,layout,
                     (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                      *)namedStructs.
                        super__Vector_base<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
  std::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,
                  "\tdEQP_FragColor = vec4(1.0, v_vtxResult, result, 1.0);\n}\n");
  std::vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
  ::~vector((vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
             *)local_48);
  return;
}

Assistant:

void generateFragmentShader (std::ostringstream& src, glu::GLSLVersion glslVersion, const ShaderInterface& interface, const UniformLayout& layout, const std::map<int, void*>& blockPointers)
{
	DE_ASSERT(isSupportedGLSLVersion(glslVersion));

	src << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
	src << "in mediump float v_vtxResult;\n";
	src << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";
	src << "\n";

	std::vector<const StructType*> namedStructs;
	interface.getNamedStructs(namedStructs);
	for (std::vector<const StructType*>::const_iterator structIter = namedStructs.begin(); structIter != namedStructs.end(); structIter++)
		generateDeclaration(src, **structIter, 0);

	for (int blockNdx = 0; blockNdx < interface.getNumUniformBlocks(); blockNdx++)
	{
		const UniformBlock& block = interface.getUniformBlock(blockNdx);
		if (block.getFlags() & DECLARE_FRAGMENT)
			generateDeclaration(src, block);
	}

	// Comparison utilities.
	src << "\n";
	generateCompareFuncs(src, interface);

	src << "\n"
		   "void main (void)\n"
		   "{\n"
		   "	mediump float result = 1.0;\n";

	// Value compare.
	generateCompareSrc(src, "result", interface, layout, blockPointers, false);

	src << "	dEQP_FragColor = vec4(1.0, v_vtxResult, result, 1.0);\n"
		   "}\n";
}